

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

errr finish_parse_meth(parser *p)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  blow_method *pbVar7;
  void *pvVar8;
  undefined8 *p_00;
  uint16_t uVar9;
  long lVar10;
  long lVar11;
  
  z_info->blow_methods_max = 0;
  pvVar8 = parser_priv(p);
  uVar9 = z_info->blow_methods_max;
  if (pvVar8 != (void *)0x0) {
    do {
      uVar9 = uVar9 + 1;
      pvVar8 = *(void **)((long)pvVar8 + 0x28);
    } while (pvVar8 != (void *)0x0);
    z_info->blow_methods_max = uVar9;
  }
  blow_methods = (blow_method *)mem_zalloc((ulong)((uint)uVar9 * 0x30) + 0x30);
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    lVar11 = 0x60;
    do {
      pbVar7 = blow_methods;
      lVar10 = (long)&blow_methods->name + lVar11;
      uVar2 = *p_00;
      uVar3 = p_00[1];
      uVar4 = p_00[2];
      uVar5 = p_00[3];
      uVar6 = p_00[5];
      puVar1 = (undefined8 *)((long)blow_methods + lVar11 + -0x10);
      *puVar1 = p_00[4];
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)pbVar7 + lVar11 + -0x20);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      puVar1 = (undefined8 *)((long)&pbVar7[-1].name + lVar11);
      *puVar1 = uVar2;
      puVar1[1] = uVar3;
      puVar1 = (undefined8 *)p_00[5];
      if (puVar1 == (undefined8 *)0x0) {
        lVar10 = 0;
      }
      *(long *)((long)pbVar7 + lVar11 + -8) = lVar10;
      mem_free(p_00);
      lVar11 = lVar11 + 0x30;
      p_00 = puVar1;
    } while (puVar1 != (undefined8 *)0x0);
  }
  z_info->blow_methods_max = z_info->blow_methods_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_meth(struct parser *p) {
	struct blow_method *meth, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->blow_methods_max = 0;
	meth = parser_priv(p);
	while (meth) {
		z_info->blow_methods_max++;
		meth = meth->next;
	}

	/* Allocate the direct access list and copy the data to it */
	blow_methods = mem_zalloc((z_info->blow_methods_max + 1) * sizeof(*meth));
	for (meth = parser_priv(p); meth; meth = next, count++) {
		memcpy(&blow_methods[count], meth, sizeof(*meth));
		next = meth->next;
		if (next)
			blow_methods[count].next = &blow_methods[count + 1];
		else
			blow_methods[count].next = NULL;

		mem_free(meth);
	}
	z_info->blow_methods_max += 1;

	parser_destroy(p);
	return 0;
}